

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disci_intersector.h
# Opt level: O2

void embree::avx512::DiscMiIntersector1<4,_true>::intersect
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *Disc)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined1 auVar5 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  Geometry *pGVar9;
  long lVar10;
  __int_type_conflict _Var11;
  RTCFilterFunctionN p_Var12;
  bool bVar13;
  undefined1 auVar14 [16];
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  byte bVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  uint uVar21;
  ulong uVar22;
  byte bVar23;
  uint uVar24;
  uint uVar25;
  byte bVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [64];
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined4 uVar49;
  undefined1 auVar50 [16];
  undefined1 auVar51 [64];
  int local_134;
  Scene *local_130;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  DiscIntersectorHitM<4> hit;
  undefined1 local_48 [16];
  undefined1 auVar37 [64];
  
  local_130 = context->scene;
  pGVar9 = (local_130->geometries).items[Disc->sharedGeomID].ptr;
  lVar10 = *(long *)&pGVar9->field_0x58;
  _Var11 = pGVar9[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar28 = *(undefined1 (*) [16])(lVar10 + (Disc->primIDs).field_0.i[0] * _Var11);
  auVar35 = *(undefined1 (*) [16])(lVar10 + (Disc->primIDs).field_0.i[1] * _Var11);
  auVar38 = *(undefined1 (*) [16])(lVar10 + (Disc->primIDs).field_0.i[2] * _Var11);
  auVar5 = *(undefined1 (*) [16])(lVar10 + (Disc->primIDs).field_0.i[3] * _Var11);
  auVar14 = vunpcklps_avx(auVar28,auVar38);
  auVar38 = vunpckhps_avx(auVar28,auVar38);
  auVar28 = vunpcklps_avx(auVar35,auVar5);
  auVar35 = vunpckhps_avx(auVar35,auVar5);
  auVar29 = vunpcklps_avx(auVar14,auVar28);
  auVar5 = vunpckhps_avx(auVar14,auVar28);
  auVar14 = vunpcklps_avx(auVar38,auVar35);
  local_48 = vpbroadcastd_avx512vl();
  aVar6 = (ray->super_RayK<1>).dir.field_0;
  fVar1 = *(float *)&(ray->super_RayK<1>).dir.field_0;
  auVar33._4_4_ = fVar1;
  auVar33._0_4_ = fVar1;
  auVar33._8_4_ = fVar1;
  auVar33._12_4_ = fVar1;
  auVar28 = *(undefined1 (*) [16])((long)&(ray->super_RayK<1>).dir.field_0 + 4);
  fVar2 = (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar34._4_4_ = fVar2;
  auVar34._0_4_ = fVar2;
  auVar34._8_4_ = fVar2;
  auVar34._12_4_ = fVar2;
  fVar4 = (ray->super_RayK<1>).dir.field_0.m128[2];
  fVar41 = (ray->super_RayK<1>).dir.field_0.m128[3];
  fVar42 = (ray->super_RayK<1>).tfar;
  fVar43 = (float)(ray->super_RayK<1>).mask;
  fVar3 = (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar50._0_4_ = fVar4 * fVar4;
  auVar50._4_4_ = fVar41 * fVar41;
  auVar50._8_4_ = fVar42 * fVar42;
  auVar50._12_4_ = fVar43 * fVar43;
  auVar28 = vfmadd231ps_fma(auVar50,auVar28,auVar28);
  auVar28 = vfmadd231ps_fma(auVar28,(undefined1  [16])aVar6,(undefined1  [16])aVar6);
  uVar49 = auVar28._0_4_;
  auVar30._4_4_ = uVar49;
  auVar30._0_4_ = uVar49;
  auVar30._8_4_ = uVar49;
  auVar30._12_4_ = uVar49;
  auVar27 = vrcp14ps_avx512vl(auVar30);
  auVar28._8_4_ = 0x3f800000;
  auVar28._0_8_ = 0x3f8000003f800000;
  auVar28._12_4_ = 0x3f800000;
  auVar28 = vfnmadd213ps_avx512vl(auVar30,auVar27,auVar28);
  auVar28 = vfmadd132ps_fma(auVar28,auVar27,auVar27);
  uVar49 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
  auVar27._4_4_ = uVar49;
  auVar27._0_4_ = uVar49;
  auVar27._8_4_ = uVar49;
  auVar27._12_4_ = uVar49;
  auVar27 = vsubps_avx512vl(auVar29,auVar27);
  uVar49 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
  auVar29._4_4_ = uVar49;
  auVar29._0_4_ = uVar49;
  auVar29._8_4_ = uVar49;
  auVar29._12_4_ = uVar49;
  auVar29 = vsubps_avx512vl(auVar5,auVar29);
  uVar49 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
  auVar5._4_4_ = uVar49;
  auVar5._0_4_ = uVar49;
  auVar5._8_4_ = uVar49;
  auVar5._12_4_ = uVar49;
  auVar30 = vsubps_avx512vl(auVar14,auVar5);
  fVar41 = auVar30._0_4_;
  auVar45._0_4_ = fVar41 * fVar3;
  fVar42 = auVar30._4_4_;
  auVar45._4_4_ = fVar42 * fVar3;
  fVar43 = auVar30._8_4_;
  auVar45._8_4_ = fVar43 * fVar3;
  fVar44 = auVar30._12_4_;
  auVar45._12_4_ = fVar44 * fVar3;
  auVar5 = vfmadd231ps_fma(auVar45,auVar29,auVar34);
  auVar5 = vfmadd231ps_fma(auVar5,auVar27,auVar33);
  hit.vt.field_0._0_4_ = auVar5._0_4_ * auVar28._0_4_;
  hit.vt.field_0._4_4_ = auVar5._4_4_ * auVar28._4_4_;
  hit.vt.field_0._8_4_ = auVar5._8_4_ * auVar28._8_4_;
  hit.vt.field_0._12_4_ = auVar5._12_4_ * auVar28._12_4_;
  auVar51 = ZEXT1664((undefined1  [16])hit.vt.field_0);
  fVar4 = (ray->super_RayK<1>).tfar;
  auVar14._4_4_ = fVar4;
  auVar14._0_4_ = fVar4;
  auVar14._8_4_ = fVar4;
  auVar14._12_4_ = fVar4;
  uVar15 = vcmpps_avx512vl((undefined1  [16])hit.vt.field_0,auVar14,2);
  auVar28 = vpbroadcastd_avx512vl();
  uVar49 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar19._4_4_ = uVar49;
  auVar19._0_4_ = uVar49;
  auVar19._8_4_ = uVar49;
  auVar19._12_4_ = uVar49;
  uVar16 = vcmpps_avx512vl((undefined1  [16])hit.vt.field_0,auVar19,0xd);
  uVar17 = vpcmpgtd_avx512vl(auVar28,_DAT_01f4ad30);
  bVar26 = (byte)uVar15 & (byte)uVar16 & 0xf & (byte)uVar17;
  if (bVar26 != 0) {
    auVar5 = vunpckhps_avx(auVar38,auVar35);
    auVar38._0_4_ = hit.vt.field_0._0_4_ * fVar1;
    auVar38._4_4_ = hit.vt.field_0._4_4_ * fVar1;
    auVar38._8_4_ = hit.vt.field_0._8_4_ * fVar1;
    auVar38._12_4_ = hit.vt.field_0._12_4_ * fVar1;
    auVar46._0_4_ = hit.vt.field_0._0_4_ * fVar2;
    auVar46._4_4_ = hit.vt.field_0._4_4_ * fVar2;
    auVar46._8_4_ = hit.vt.field_0._8_4_ * fVar2;
    auVar46._12_4_ = hit.vt.field_0._12_4_ * fVar2;
    auVar47._0_4_ = hit.vt.field_0._0_4_ * fVar3;
    auVar47._4_4_ = hit.vt.field_0._4_4_ * fVar3;
    auVar47._8_4_ = hit.vt.field_0._8_4_ * fVar3;
    auVar47._12_4_ = hit.vt.field_0._12_4_ * fVar3;
    auVar28 = vsubps_avx(auVar27,auVar38);
    auVar35 = vsubps_avx(auVar29,auVar46);
    auVar38 = vsubps_avx(auVar30,auVar47);
    auVar48._0_4_ = auVar38._0_4_ * auVar38._0_4_;
    auVar48._4_4_ = auVar38._4_4_ * auVar38._4_4_;
    auVar48._8_4_ = auVar38._8_4_ * auVar38._8_4_;
    auVar48._12_4_ = auVar38._12_4_ * auVar38._12_4_;
    auVar35 = vfmadd231ps_fma(auVar48,auVar35,auVar35);
    auVar28 = vfmadd231ps_fma(auVar35,auVar28,auVar28);
    auVar35._0_4_ = auVar5._0_4_ * auVar5._0_4_;
    auVar35._4_4_ = auVar5._4_4_ * auVar5._4_4_;
    auVar35._8_4_ = auVar5._8_4_ * auVar5._8_4_;
    auVar35._12_4_ = auVar5._12_4_ * auVar5._12_4_;
    uVar15 = vcmpps_avx512vl(auVar28,auVar35,2);
    bVar26 = (byte)uVar15 & bVar26;
    if (bVar26 != 0) {
      auVar39._0_4_ = fVar41 * fVar41;
      auVar39._4_4_ = fVar42 * fVar42;
      auVar39._8_4_ = fVar43 * fVar43;
      auVar39._12_4_ = fVar44 * fVar44;
      auVar28 = vfmadd213ps_fma(auVar29,auVar29,auVar39);
      auVar28 = vfmadd213ps_fma(auVar27,auVar27,auVar28);
      uVar15 = vcmpps_avx512vl(auVar28,auVar35,6);
      bVar26 = bVar26 & (byte)uVar15;
      if (bVar26 != 0) {
        auVar7._0_4_ = (ray->super_RayK<1>).tfar;
        auVar7._4_4_ = (ray->super_RayK<1>).mask;
        auVar7._8_4_ = (ray->super_RayK<1>).id;
        auVar7._12_4_ = (ray->super_RayK<1>).flags;
        auVar40 = ZEXT1664(auVar7);
        uVar21 = vextractps_avx(auVar7,1);
        hit.vu.field_0._0_8_ = 0;
        hit.vu.field_0._8_8_ = 0;
        hit.vv.field_0._0_8_ = 0;
        hit.vv.field_0._8_8_ = 0;
        hit.vNg.field_0._0_4_ = -fVar1;
        hit.vNg.field_0._4_4_ = -fVar1;
        hit.vNg.field_0._8_4_ = -fVar1;
        hit.vNg.field_0._12_4_ = -fVar1;
        hit.vNg.field_0._16_4_ = -fVar2;
        hit.vNg.field_0._20_4_ = -fVar2;
        hit.vNg.field_0._24_4_ = -fVar2;
        hit.vNg.field_0._28_4_ = -fVar2;
        hit.vNg.field_0._32_4_ = -fVar3;
        hit.vNg.field_0._36_4_ = -fVar3;
        hit.vNg.field_0._40_4_ = -fVar3;
        hit.vNg.field_0._44_4_ = -fVar3;
        auVar36._8_4_ = 0x7f800000;
        auVar36._0_8_ = 0x7f8000007f800000;
        auVar36._12_4_ = 0x7f800000;
        auVar37 = ZEXT1664(auVar36);
        auVar28 = vblendmps_avx512vl(auVar36,(undefined1  [16])hit.vt.field_0);
        auVar31._0_4_ = (uint)(bVar26 & 1) * auVar28._0_4_ | (uint)!(bool)(bVar26 & 1) * (int)-fVar1
        ;
        bVar13 = (bool)(bVar26 >> 1 & 1);
        auVar31._4_4_ = (uint)bVar13 * auVar28._4_4_ | (uint)!bVar13 * (int)-fVar1;
        bVar13 = (bool)(bVar26 >> 2 & 1);
        auVar31._8_4_ = (uint)bVar13 * auVar28._8_4_ | (uint)!bVar13 * (int)-fVar1;
        auVar31._12_4_ =
             (uint)(bVar26 >> 3) * auVar28._12_4_ | (uint)!(bool)(bVar26 >> 3) * (int)-fVar1;
        auVar28 = vshufps_avx(auVar31,auVar31,0xb1);
        auVar28 = vminps_avx(auVar28,auVar31);
        auVar35 = vshufpd_avx(auVar28,auVar28,1);
        auVar28 = vminps_avx(auVar35,auVar28);
        uVar15 = vcmpps_avx512vl(auVar31,auVar28,0);
        bVar18 = bVar26;
        if (((byte)uVar15 & bVar26) != 0) {
          bVar18 = (byte)uVar15 & bVar26;
        }
        uVar24 = 0;
        for (uVar25 = (uint)bVar18; (uVar25 & 1) == 0; uVar25 = uVar25 >> 1 | 0x80000000) {
          uVar24 = uVar24 + 1;
        }
        do {
          auVar28 = auVar51._0_16_;
          uVar25 = uVar24 & 0xff;
          h.geomID = *(uint *)(local_48 + (ulong)uVar25 * 4);
          pGVar9 = (local_130->geometries).items[h.geomID].ptr;
          if ((pGVar9->mask & uVar21) == 0) {
            bVar26 = ~(byte)(1 << (uVar24 & 0x1f)) & bVar26;
          }
          else {
            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
               (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
              uVar22 = (ulong)(uVar25 << 2);
              fVar1 = *(float *)((long)&hit.vu.field_0 + uVar22);
              fVar2 = *(float *)((long)&hit.vv.field_0 + uVar22);
              (ray->super_RayK<1>).tfar = *(float *)((long)&hit.vt.field_0 + uVar22);
              (ray->Ng).field_0.field_0.x = *(float *)((long)&hit.vNg.field_0 + uVar22);
              (ray->Ng).field_0.field_0.y = *(float *)((long)&hit.vNg.field_0 + uVar22 + 0x10);
              (ray->Ng).field_0.field_0.z = *(float *)((long)&hit.vNg.field_0 + uVar22 + 0x20);
              ray->u = fVar1;
              ray->v = fVar2;
              ray->primID = *(uint *)((long)&(Disc->primIDs).field_0 + uVar22);
              ray->geomID = h.geomID;
              ray->instID[0] = context->user->instID[0];
              ray->instPrimID[0] = context->user->instPrimID[0];
              return;
            }
            auVar31 = auVar40._0_16_;
            uVar22 = (ulong)(uVar25 * 4);
            h.Ng.field_0.field_0.x = *(float *)((long)&hit.vNg.field_0 + uVar22);
            h.Ng.field_0.field_0.y = *(float *)((long)&hit.vNg.field_0 + uVar22 + 0x10);
            h.Ng.field_0.field_0.z = *(float *)((long)&hit.vNg.field_0 + uVar22 + 0x20);
            h.u = *(float *)((long)&hit.vu.field_0 + uVar22);
            h.v = *(float *)((long)&hit.vv.field_0 + uVar22);
            h.primID = *(uint *)((long)&(Disc->primIDs).field_0 + uVar22);
            h.instID[0] = context->user->instID[0];
            h.instPrimID[0] = context->user->instPrimID[0];
            (ray->super_RayK<1>).tfar = *(float *)((long)&hit.vt.field_0 + uVar22);
            local_134 = -1;
            args.valid = &local_134;
            args.geometryUserPtr = pGVar9->userPtr;
            args.context = context->user;
            args.ray = (RTCRayN *)ray;
            args.hit = (RTCHitN *)&h;
            args.N = 1;
            if ((pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
               ((*pGVar9->intersectionFilterN)(&args), *args.valid != 0)) {
              p_Var12 = context->args->filter;
              if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                 ((((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                    RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar9->field_8).field_0x2 & 0x40) != 0)) &&
                  ((*p_Var12)(&args), *args.valid == 0)))) goto LAB_0172bc11;
              *(undefined4 *)(args.ray + 0x30) = *(undefined4 *)args.hit;
              *(undefined4 *)(args.ray + 0x34) = *(undefined4 *)(args.hit + 4);
              *(undefined4 *)(args.ray + 0x38) = *(undefined4 *)(args.hit + 8);
              *(undefined4 *)(args.ray + 0x3c) = *(undefined4 *)(args.hit + 0xc);
              auVar31 = ZEXT416(*(uint *)(args.hit + 0x10));
              *(uint *)(args.ray + 0x40) = *(uint *)(args.hit + 0x10);
              *(undefined4 *)(args.ray + 0x44) = *(undefined4 *)(args.hit + 0x14);
              *(undefined4 *)(args.ray + 0x48) = *(undefined4 *)(args.hit + 0x18);
              *(undefined4 *)(args.ray + 0x4c) = *(undefined4 *)(args.hit + 0x1c);
              *(undefined4 *)(args.ray + 0x50) = *(undefined4 *)(args.hit + 0x20);
            }
            else {
LAB_0172bc11:
              (ray->super_RayK<1>).tfar = auVar40._0_4_;
            }
            auVar51 = ZEXT1664(auVar28);
            auVar37 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
            auVar8._0_4_ = (ray->super_RayK<1>).tfar;
            auVar8._4_4_ = (ray->super_RayK<1>).mask;
            auVar8._8_4_ = (ray->super_RayK<1>).id;
            auVar8._12_4_ = (ray->super_RayK<1>).flags;
            auVar40 = ZEXT1664(auVar8);
            fVar1 = (ray->super_RayK<1>).tfar;
            auVar20._4_4_ = fVar1;
            auVar20._0_4_ = fVar1;
            auVar20._8_4_ = fVar1;
            auVar20._12_4_ = fVar1;
            uVar15 = vcmpps_avx512vl(auVar28,auVar20,2);
            bVar26 = ~(byte)(1 << (uVar24 & 0x1f)) & bVar26 & (byte)uVar15;
            uVar21 = vextractps_avx(auVar8,1);
          }
          if (bVar26 == 0) {
            return;
          }
          auVar28 = vblendmps_avx512vl(auVar37._0_16_,auVar51._0_16_);
          auVar32._0_4_ =
               (uint)(bVar26 & 1) * auVar28._0_4_ | (uint)!(bool)(bVar26 & 1) * auVar31._0_4_;
          bVar13 = (bool)(bVar26 >> 1 & 1);
          auVar32._4_4_ = (uint)bVar13 * auVar28._4_4_ | (uint)!bVar13 * auVar31._4_4_;
          bVar13 = (bool)(bVar26 >> 2 & 1);
          auVar32._8_4_ = (uint)bVar13 * auVar28._8_4_ | (uint)!bVar13 * auVar31._8_4_;
          auVar32._12_4_ =
               (uint)(bVar26 >> 3) * auVar28._12_4_ | (uint)!(bool)(bVar26 >> 3) * auVar31._12_4_;
          auVar28 = vshufps_avx(auVar32,auVar32,0xb1);
          auVar28 = vminps_avx(auVar28,auVar32);
          auVar35 = vshufpd_avx(auVar28,auVar28,1);
          auVar28 = vminps_avx(auVar35,auVar28);
          uVar15 = vcmpps_avx512vl(auVar32,auVar28,0);
          bVar23 = (byte)uVar15 & bVar26;
          bVar18 = bVar26;
          if (bVar23 != 0) {
            bVar18 = bVar23;
          }
          uVar24 = 0;
          for (uVar25 = (uint)bVar18; auVar31 = auVar32, (uVar25 & 1) == 0;
              uVar25 = uVar25 >> 1 | 0x80000000) {
            uVar24 = uVar24 + 1;
          }
        } while( true );
      }
    }
  }
  return;
}

Assistant:

static __forceinline void intersect(const Precalculations& pre,
                                          RayHit& ray,
                                          RayQueryContext* context,
                                          const Primitive& Disc)
      {
        STAT3(normal.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(Disc.geomID());
        Vec4vf<M> v0; Disc.gather(v0, geom);
        const vbool<M> valid = Disc.valid();
        DiscIntersector1<M>::intersect(
          valid, ray, context, geom, pre, v0, Intersect1EpilogM<M, filter>(ray, context, Disc.geomID(), Disc.primID()));
      }